

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool>
* __thiscall
pstore::json::details::whitespace_matcher<pstore::json::null_output>::consume_body
          (pair<std::unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>,_bool>
           *__return_storage_ptr__,whitespace_matcher<pstore::json::null_output> *this,
          parser<pstore::json::null_output> *parser,char c)

{
  uint *puVar1;
  undefined3 in_register_00000009;
  int iVar2;
  bool bVar3;
  
  iVar2 = CONCAT31(in_register_00000009,c);
  bVar3 = true;
  if (iVar2 != 9) {
    if (iVar2 == 10) {
      (parser->coordinate_).column = 0;
      puVar1 = &(parser->coordinate_).row;
      *puVar1 = *puVar1 + 1;
    }
    else {
      if (iVar2 == 0x2f) {
        if ((parser->extensions_ & (multi_line_comments|single_line_comments)) != none) {
          (this->super_matcher<pstore::json::null_output>).state_ = 5;
          goto LAB_0014cf53;
        }
      }
      else {
        if (iVar2 == 0x20) goto LAB_0014cf53;
        if (iVar2 == 0x23) {
          if ((parser->extensions_ & bash_comments) != none) {
            (this->super_matcher<pstore::json::null_output>).state_ = 4;
            goto LAB_0014cf53;
          }
        }
        else if (iVar2 == 0xd) {
          cr(this,parser,crlf_state);
          goto LAB_0014cf53;
        }
      }
      (this->super_matcher<pstore::json::null_output>).state_ = 1;
      bVar3 = false;
    }
  }
LAB_0014cf53:
  *(undefined8 *)
   &(__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
       = 1;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  .super__Head_base<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_false>.
  _M_head_impl = (matcher<pstore::json::null_output> *)0x0;
  __return_storage_ptr__->second = bVar3;
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            whitespace_matcher<Callbacks>::consume_body (parser<Callbacks> & parser, char c) {
                auto const stop_retry = [this] () {
                    // Stop, pop this matcher, and retry with the same character.
                    this->set_state (done_state);
                    return std::pair<typename matcher<Callbacks>::pointer, bool>{nullptr, false};
                };

                using details::char_set;
                switch (c) {
                case char_set::space: break; // Just consume.
                case char_set::tab:
                    // TODO: tab expansion.
                    break;
                case char_set::cr: this->cr (parser, crlf_state); break;
                case char_set::lf: this->lf (parser); break;
                case char_set::hash:
                    if (!parser.extension_enabled (extensions::bash_comments)) {
                        return stop_retry ();
                    }
                    this->set_state (single_line_comment_state);
                    break;
                case char_set::slash:
                    if (!parser.extension_enabled (extensions::single_line_comments) &&
                        !parser.extension_enabled (extensions::multi_line_comments)) {
                        return stop_retry ();
                    }
                    this->set_state (comment_start_state);
                    break;
                default: return stop_retry ();
                }
                return {nullptr, true}; // Consume this character.
            }